

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * vdbeSorterRowkey(VdbeSorter *pSorter,int *pnKey)

{
  SorterRecord *pSVar1;
  PmaReader *pPVar2;
  
  if (pSorter->bUsePMA != '\0') {
    if (pSorter->bUseThreads == '\0') {
      pPVar2 = pSorter->pMerger->aReadr + pSorter->pMerger->aTree[1];
    }
    else {
      pPVar2 = pSorter->pReader;
    }
    *pnKey = pPVar2->nKey;
    return pPVar2->aKey;
  }
  pSVar1 = (pSorter->list).pList;
  *pnKey = pSVar1->nVal;
  return pSVar1 + 1;
}

Assistant:

static void *vdbeSorterRowkey(
  const VdbeSorter *pSorter,      /* Sorter object */
  int *pnKey                      /* OUT: Size of current key in bytes */
){
  void *pKey;
  if( pSorter->bUsePMA ){
    PmaReader *pReader;
#if SQLITE_MAX_WORKER_THREADS>0
    if( pSorter->bUseThreads ){
      pReader = pSorter->pReader;
    }else
#endif
    /*if( !pSorter->bUseThreads )*/{
      pReader = &pSorter->pMerger->aReadr[pSorter->pMerger->aTree[1]];
    }
    *pnKey = pReader->nKey;
    pKey = pReader->aKey;
  }else{
    *pnKey = pSorter->list.pList->nVal;
    pKey = SRVAL(pSorter->list.pList);
  }
  return pKey;
}